

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldBaseTestCase.cpp
# Opt level: O0

void __thiscall SuiteFieldBaseTests::Testset::~Testset(Testset *this)

{
  Testset *this_local;
  
  ~Testset(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(set)
{
  FieldBase object( 12, "VALUE" );
  object.setString( "VALUE" );
  CHECK_EQUAL( "12=VALUE\001", object.getFixString() );
  CHECK_EQUAL( 542, object.getTotal() );
  CHECK_EQUAL( 9lu, object.getLength() );
  object.setString( "VALUF" );
  CHECK_EQUAL( "12=VALUF\001", object.getFixString() );
  CHECK_EQUAL( 543, object.getTotal() );
  CHECK_EQUAL( 9lu, object.getLength() );
  object.setTag( 13 );
  CHECK_EQUAL( "13=VALUF\001", object.getFixString() );
  CHECK_EQUAL( 544, object.getTotal() );
  CHECK_EQUAL( 9lu, object.getLength() );
}